

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpc_parse_fold(mpc_input_t *i,mpc_fold_t f,int n,mpc_val_t **xs)

{
  mpc_val_t *pmVar1;
  void *pvVar2;
  mpc_input_t *in_RCX;
  int in_EDX;
  code *in_RSI;
  mpc_val_t **in_RDI;
  mpc_input_t *unaff_retaddr;
  int j;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_RSI == mpcf_null) {
    pmVar1 = mpcf_null(in_EDX,(mpc_val_t **)in_RCX);
  }
  else if (in_RSI == mpcf_fst) {
    pmVar1 = mpcf_fst(in_EDX,(mpc_val_t **)in_RCX);
  }
  else if (in_RSI == mpcf_snd) {
    pmVar1 = mpcf_snd(in_EDX,(mpc_val_t **)in_RCX);
  }
  else if (in_RSI == mpcf_trd) {
    pmVar1 = mpcf_trd(in_EDX,(mpc_val_t **)in_RCX);
  }
  else if (in_RSI == mpcf_fst_free) {
    pmVar1 = mpcf_input_fst_free((mpc_input_t *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc,(mpc_val_t **)0x2a0230);
  }
  else if (in_RSI == mpcf_snd_free) {
    pmVar1 = mpcf_input_snd_free((mpc_input_t *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc,(mpc_val_t **)0x2a025b);
  }
  else if (in_RSI == mpcf_trd_free) {
    pmVar1 = mpcf_input_trd_free((mpc_input_t *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc,(mpc_val_t **)0x2a0286);
  }
  else if (in_RSI == mpcf_strfold) {
    pmVar1 = mpcf_input_strfold((mpc_input_t *)mpcf_strfold,in_EDX,(mpc_val_t **)in_RCX);
  }
  else if (in_RSI == mpcf_state_ast) {
    pmVar1 = mpcf_input_state_ast
                       (unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20),in_RDI);
  }
  else {
    for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
      pvVar2 = mpc_export(in_RCX,(void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
      *(void **)(in_RCX->mem_full + (long)iVar3 * 8 + -0x78) = pvVar2;
    }
    pmVar1 = (mpc_val_t *)(*in_RSI)(iVar3,in_RCX);
  }
  return pmVar1;
}

Assistant:

static mpc_val_t *mpc_parse_fold(mpc_input_t *i, mpc_fold_t f, int n, mpc_val_t **xs) {
  int j;
  if (f == mpcf_null)      { return mpcf_null(n, xs); }
  if (f == mpcf_fst)       { return mpcf_fst(n, xs); }
  if (f == mpcf_snd)       { return mpcf_snd(n, xs); }
  if (f == mpcf_trd)       { return mpcf_trd(n, xs); }
  if (f == mpcf_fst_free)  { return mpcf_input_fst_free(i, n, xs); }
  if (f == mpcf_snd_free)  { return mpcf_input_snd_free(i, n, xs); }
  if (f == mpcf_trd_free)  { return mpcf_input_trd_free(i, n, xs); }
  if (f == mpcf_strfold)   { return mpcf_input_strfold(i, n, xs); }
  if (f == mpcf_state_ast) { return mpcf_input_state_ast(i, n, xs); }
  for (j = 0; j < n; j++) { xs[j] = mpc_export(i, xs[j]); }
  return f(j, xs);
}